

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tri_dist.h
# Opt level: O3

double manifold::DistanceTriangleTriangleSquared
                 (array<linalg::vec<double,_3>,_3UL> *p,array<linalg::vec<double,_3>,_3UL> *q)

{
  vec<double,_3> *pvVar1;
  double *pdVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  double dVar5;
  byte bVar6;
  uint extraout_EAX;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  vec3 *pvVar11;
  vec3 *a;
  long lVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  undefined1 auVar19 [16];
  double dVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  double dVar24;
  undefined1 auVar23 [16];
  vec3 cp;
  vec3 cq;
  vec3 local_188;
  double local_168;
  long local_158;
  ulong local_148;
  vec3 local_108;
  array<linalg::vec<double,_3>,_3UL> *local_f0;
  vec3 local_e8;
  double dStack_d0;
  double local_c8;
  double dStack_c0;
  double local_b8;
  double dStack_b0;
  double local_a8;
  vec3 local_98;
  double dStack_80;
  double local_78;
  double dStack_70;
  double local_68;
  double dStack_60;
  double local_58;
  
  local_68 = p->_M_elems[0].x;
  dStack_60 = p->_M_elems[0].y;
  local_78 = p->_M_elems[1].y;
  local_98.x = p->_M_elems[1].x - local_68;
  local_98.y = local_78 - dStack_60;
  dStack_70 = p->_M_elems[1].z;
  dVar13 = p->_M_elems[2].x;
  local_98.z = dStack_70 - p->_M_elems[0].z;
  dStack_80 = dVar13 - p->_M_elems[1].x;
  dVar14 = p->_M_elems[2].y;
  local_58 = p->_M_elems[2].z;
  local_78 = dVar14 - local_78;
  dStack_70 = local_58 - dStack_70;
  local_58 = p->_M_elems[0].z - local_58;
  local_68 = local_68 - dVar13;
  dStack_60 = dStack_60 - dVar14;
  local_b8 = q->_M_elems[0].x;
  dStack_b0 = q->_M_elems[0].y;
  local_c8 = q->_M_elems[1].y;
  local_e8.x = q->_M_elems[1].x - local_b8;
  local_e8.y = local_c8 - dStack_b0;
  dStack_c0 = q->_M_elems[1].z;
  dVar13 = q->_M_elems[2].x;
  local_e8.z = dStack_c0 - q->_M_elems[0].z;
  dStack_d0 = dVar13 - q->_M_elems[1].x;
  dVar14 = q->_M_elems[2].y;
  local_a8 = q->_M_elems[2].z;
  local_c8 = dVar14 - local_c8;
  dStack_c0 = local_a8 - dStack_c0;
  local_a8 = q->_M_elems[0].z - local_a8;
  local_b8 = local_b8 - dVar13;
  dStack_b0 = dStack_b0 - dVar14;
  local_168 = 1.79769313486232e+308;
  local_158 = 0;
  local_148 = 0;
  local_f0 = p;
  do {
    pvVar11 = local_f0->_M_elems + local_158;
    a = &local_98 + local_158;
    uVar8 = (ulong)((int)local_158 - 1);
    if (local_158 == 0) {
      uVar8 = 2;
    }
    pvVar1 = local_f0->_M_elems + uVar8;
    lVar12 = 0;
    uVar8 = 0xffffffff;
    do {
      local_188.x = 0.0;
      local_188.y = 0.0;
      local_188.z = 0.0;
      local_108.z = 0.0;
      local_108.x = 0.0;
      local_108.y = 0.0;
      EdgeEdgeDist(&local_188,&local_108,pvVar11,a,(vec3 *)((long)&q->_M_elems[0].x + lVar12),
                   (vec3 *)((long)&local_e8.x + lVar12));
      dVar14 = local_108.y - local_188.y;
      dVar16 = local_108.x - local_188.x;
      dVar17 = local_108.z - local_188.z;
      dVar13 = dVar17 * dVar17 + dVar14 * dVar14 + dVar16 * dVar16;
      uVar7 = extraout_EAX;
      if (dVar13 <= local_168) {
        uVar9 = uVar8 & 0xffffffff;
        if (lVar12 == 0) {
          uVar9 = 2;
        }
        dVar18 = dVar16 * (pvVar1->x - local_188.x) + 0.0 + dVar14 * (pvVar1->y - local_188.y) +
                 dVar17 * (pvVar1->z - local_188.z);
        dVar14 = dVar16 * (q->_M_elems[uVar9].x - local_108.x) + 0.0 +
                 dVar14 * (q->_M_elems[uVar9].y - local_108.y) +
                 dVar17 * (q->_M_elems[uVar9].z - local_108.z);
        if ((dVar18 <= 0.0) && (0.0 <= dVar14)) {
          return dVar13;
        }
        if (dVar18 <= 0.0) {
          dVar18 = 0.0;
        }
        else if (0.0 < dVar14) {
          dVar14 = 0.0;
        }
        bVar10 = 0.0 < dVar14 + (dVar13 - dVar18);
        uVar7 = (uint)CONCAT71((int7)(uVar9 * 3 >> 8),bVar10);
        local_148 = CONCAT71((int7)(local_148 >> 8),(byte)local_148 | bVar10);
        local_168 = dVar13;
      }
      uVar8 = uVar8 + 1;
      lVar12 = lVar12 + 0x18;
    } while (lVar12 != 0x48);
    local_158 = local_158 + 1;
  } while (local_158 != 3);
  dVar13 = local_98.z * dStack_80 - dStack_70 * local_98.x;
  dVar14 = local_98.x * local_78 - local_98.y * dStack_80;
  dVar16 = local_98.y * dStack_70 - local_98.z * local_78;
  auVar22._0_8_ = dVar16 * dVar16 + dVar13 * dVar13 + dVar14 * dVar14;
  if (1e-15 < auVar22._0_8_) {
    dVar17 = local_f0->_M_elems[0].x;
    dVar18 = local_f0->_M_elems[0].y;
    dVar5 = local_f0->_M_elems[0].z;
    local_188.x = dVar14 * (dVar5 - q->_M_elems[0].z) +
                  (dVar17 - q->_M_elems[0].x) * dVar16 + 0.0 + dVar13 * (dVar18 - q->_M_elems[0].y);
    local_188.y = (dVar17 - q->_M_elems[1].x) * dVar16 + 0.0 + dVar13 * (dVar18 - q->_M_elems[1].y)
                  + (dVar5 - q->_M_elems[1].z) * dVar14;
    local_188.z = (dVar17 - q->_M_elems[2].x) * dVar16 + 0.0 + dVar13 * (dVar18 - q->_M_elems[2].y)
                  + (dVar5 - q->_M_elems[2].z) * dVar14;
    if (((local_188.x <= 0.0) || (local_188.y <= 0.0)) || (local_188.z <= 0.0)) {
      if (local_188.x < 0.0) {
        auVar4._8_8_ = -(ulong)(local_188.z < 0.0);
        auVar4._0_8_ = -(ulong)(local_188.y < 0.0);
        uVar7 = movmskpd(uVar7,auVar4);
        if (((uVar7 & 1) != 0) &&
           (bVar6 = (byte)uVar7 >> 1, uVar7 = CONCAT31((int3)(uVar7 >> 8),bVar6), bVar6 != 0)) {
          bVar10 = local_188.x <= local_188.y;
          pvVar11 = (vec3 *)&local_188.y;
          if (local_188.y < local_188.x) {
            pvVar11 = &local_188;
          }
          if (local_188.z < pvVar11->x || local_188.z == pvVar11->x) goto LAB_001697d7;
          goto LAB_00169783;
        }
      }
    }
    else {
      bVar10 = local_188.y <= local_188.x;
      pvVar11 = (vec3 *)&local_188.y;
      if (local_188.x < local_188.y) {
        pvVar11 = &local_188;
      }
      if (pvVar11->x <= local_188.z) {
LAB_001697d7:
        uVar8 = (ulong)bVar10;
      }
      else {
LAB_00169783:
        uVar8 = 2;
      }
      uVar7 = (uint)uVar8;
      dVar24 = q->_M_elems[uVar8].x;
      pdVar2 = &q->_M_elems[uVar8].y;
      dVar15 = *pdVar2;
      dVar20 = pdVar2[1];
      local_148 = 1;
      if (0.0 < (dVar16 * local_98.y - local_98.x * dVar13) * (dVar20 - dVar5) +
                (dVar13 * local_98.z - local_98.y * dVar14) * (dVar24 - dVar17) + 0.0 +
                (dVar14 * local_98.x - local_98.z * dVar16) * (dVar15 - dVar18)) {
        if ((0.0 < (local_78 * dVar16 + dStack_80 * -dVar13) * (dVar20 - local_f0->_M_elems[1].z) +
                   (dStack_70 * dVar13 + local_78 * -dVar14) * (dVar24 - local_f0->_M_elems[1].x) +
                   0.0 + (dStack_80 * dVar14 + dStack_70 * -dVar16) *
                         (dVar15 - local_f0->_M_elems[1].y)) &&
           (0.0 < (dStack_60 * dVar16 + local_68 * -dVar13) * (dVar20 - local_f0->_M_elems[2].z) +
                  (dVar13 * local_58 + dStack_60 * -dVar14) * (dVar24 - local_f0->_M_elems[2].x) +
                  0.0 + (local_68 * dVar14 + local_58 * -dVar16) *
                        (dVar15 - local_f0->_M_elems[2].y))) {
          lVar12 = 0;
          if (uVar7 != 0) {
            lVar12 = (ulong)(uVar7 != 1) * 8 + 8;
          }
          dVar17 = *(double *)((long)&local_188.x + lVar12);
          dVar15 = ((dVar13 * dVar17) / auVar22._0_8_ + dVar15) - dVar15;
          auVar21._0_8_ = dVar14 * dVar17;
          auVar21._8_8_ = dVar16 * dVar17;
          auVar22._8_8_ = auVar22._0_8_;
          auVar22 = divpd(auVar21,auVar22);
          dVar20 = (auVar22._0_8_ + dVar20) - dVar20;
          dVar24 = (auVar22._8_8_ + dVar24) - dVar24;
          return dVar24 * dVar24 + dVar15 * dVar15 + dVar20 * dVar20;
        }
      }
    }
  }
  dVar13 = local_e8.z * dStack_d0 - dStack_c0 * local_e8.x;
  dVar14 = local_e8.x * local_c8 - local_e8.y * dStack_d0;
  dVar16 = local_e8.y * dStack_c0 - local_e8.z * local_c8;
  auVar19._0_8_ = dVar16 * dVar16 + dVar13 * dVar13 + dVar14 * dVar14;
  if (auVar19._0_8_ <= 1e-15) goto LAB_00169e69;
  dVar17 = q->_M_elems[0].x;
  dVar18 = q->_M_elems[0].y;
  dVar5 = q->_M_elems[0].z;
  local_188.x = dVar14 * (dVar5 - local_f0->_M_elems[0].z) +
                (dVar17 - local_f0->_M_elems[0].x) * dVar16 + 0.0 +
                dVar13 * (dVar18 - local_f0->_M_elems[0].y);
  local_188.y = (dVar17 - local_f0->_M_elems[1].x) * dVar16 + 0.0 +
                dVar13 * (dVar18 - local_f0->_M_elems[1].y) +
                (dVar5 - local_f0->_M_elems[1].z) * dVar14;
  local_188.z = (dVar17 - local_f0->_M_elems[2].x) * dVar16 + 0.0 +
                dVar13 * (dVar18 - local_f0->_M_elems[2].y) +
                (dVar5 - local_f0->_M_elems[2].z) * dVar14;
  if (((local_188.x <= 0.0) || (local_188.y <= 0.0)) || (local_188.z <= 0.0)) {
    if (0.0 <= local_188.x) goto LAB_00169e69;
    auVar3._8_8_ = -(ulong)(local_188.z < 0.0);
    auVar3._0_8_ = -(ulong)(local_188.y < 0.0);
    uVar7 = movmskpd(uVar7,auVar3);
    if (((uVar7 & 1) == 0) || ((byte)((byte)uVar7 >> 1) == 0)) goto LAB_00169e69;
    bVar10 = local_188.x <= local_188.y;
    pvVar11 = &local_188;
    if (local_188.x <= local_188.y) {
      pvVar11 = (vec3 *)&local_188.y;
    }
    if (local_188.z < pvVar11->x || local_188.z == pvVar11->x) goto LAB_00169c4a;
LAB_00169bfb:
    uVar7 = 2;
  }
  else {
    bVar10 = local_188.y <= local_188.x;
    pvVar11 = &local_188;
    if (local_188.y <= local_188.x) {
      pvVar11 = (vec3 *)&local_188.y;
    }
    if (local_188.z < pvVar11->x) goto LAB_00169bfb;
LAB_00169c4a:
    uVar7 = (uint)bVar10;
  }
  dVar24 = local_f0->_M_elems[uVar7].x;
  pdVar2 = &local_f0->_M_elems[uVar7].y;
  dVar15 = *pdVar2;
  dVar20 = pdVar2[1];
  local_148 = 1;
  if (0.0 < (dVar16 * local_e8.y - local_e8.x * dVar13) * (dVar20 - dVar5) +
            (dVar13 * local_e8.z - local_e8.y * dVar14) * (dVar24 - dVar17) + 0.0 +
            (dVar14 * local_e8.x - local_e8.z * dVar16) * (dVar15 - dVar18)) {
    if ((0.0 < (local_c8 * dVar16 + dStack_d0 * -dVar13) * (dVar20 - q->_M_elems[1].z) +
               (dStack_c0 * dVar13 + local_c8 * -dVar14) * (dVar24 - q->_M_elems[1].x) + 0.0 +
               (dStack_d0 * dVar14 + dStack_c0 * -dVar16) * (dVar15 - q->_M_elems[1].y)) &&
       (0.0 < (dStack_b0 * dVar16 + local_b8 * -dVar13) * (dVar20 - q->_M_elems[2].z) +
              (dVar13 * local_a8 + dStack_b0 * -dVar14) * (dVar24 - q->_M_elems[2].x) + 0.0 +
              (local_b8 * dVar14 + local_a8 * -dVar16) * (dVar15 - q->_M_elems[2].y))) {
      lVar12 = 0;
      if (uVar7 != 0) {
        lVar12 = (ulong)(uVar7 != 1) * 8 + 8;
      }
      dVar17 = *(double *)((long)&local_188.x + lVar12);
      dVar15 = dVar15 - ((dVar13 * dVar17) / auVar19._0_8_ + dVar15);
      auVar23._0_8_ = dVar14 * dVar17;
      auVar23._8_8_ = dVar16 * dVar17;
      auVar19._8_8_ = auVar19._0_8_;
      auVar22 = divpd(auVar23,auVar19);
      dVar20 = dVar20 - (auVar22._0_8_ + dVar20);
      dVar24 = dVar24 - (auVar22._8_8_ + dVar24);
      return dVar24 * dVar24 + dVar15 * dVar15 + dVar20 * dVar20;
    }
  }
LAB_00169e69:
  if ((local_148 & 1) == 0) {
    local_168 = 0.0;
  }
  return local_168;
}

Assistant:

inline auto DistanceTriangleTriangleSquared(const std::array<vec3, 3>& p,
                                            const std::array<vec3, 3>& q) {
  std::array<vec3, 3> Sv;
  Sv[0] = p[1] - p[0];
  Sv[1] = p[2] - p[1];
  Sv[2] = p[0] - p[2];

  std::array<vec3, 3> Tv;
  Tv[0] = q[1] - q[0];
  Tv[1] = q[2] - q[1];
  Tv[2] = q[0] - q[2];

  bool shown_disjoint = false;

  auto mindd = std::numeric_limits<double>::max();

  for (uint32_t i = 0; i < 3; i++) {
    for (uint32_t j = 0; j < 3; j++) {
      vec3 cp;
      vec3 cq;
      EdgeEdgeDist(cp, cq, p[i], Sv[i], q[j], Tv[j]);
      const vec3 V = cq - cp;
      const auto dd = la::dot(V, V);

      if (dd <= mindd) {
        mindd = dd;

        uint32_t id = i + 2;
        if (id >= 3) id -= 3;
        vec3 Z = p[id] - cp;
        auto a = la::dot(Z, V);
        id = j + 2;
        if (id >= 3) id -= 3;
        Z = q[id] - cq;
        auto b = la::dot(Z, V);

        if ((a <= 0.0) && (b >= 0.0)) {
          return la::dot(V, V);
        };

        if (a <= 0.0)
          a = 0.0;
        else if (b > 0.0)
          b = 0.0;

        if ((mindd - a + b) > 0.0) shown_disjoint = true;
      }
    }
  }

  vec3 Sn = la::cross(Sv[0], Sv[1]);
  auto Snl = la::dot(Sn, Sn);

  if (Snl > 1e-15) {
    const vec3 Tp(la::dot(p[0] - q[0], Sn), la::dot(p[0] - q[1], Sn),
                  la::dot(p[0] - q[2], Sn));

    int index = -1;
    if ((Tp[0] > 0.0) && (Tp[1] > 0.0) && (Tp[2] > 0.0)) {
      index = Tp[0] < Tp[1] ? 0 : 1;
      if (Tp[2] < Tp[index]) index = 2;
    } else if ((Tp[0] < 0.0) && (Tp[1] < 0.0) && (Tp[2] < 0.0)) {
      index = Tp[0] > Tp[1] ? 0 : 1;
      if (Tp[2] > Tp[index]) index = 2;
    }

    if (index >= 0) {
      shown_disjoint = true;

      const vec3& qIndex = q[index];

      vec3 V = qIndex - p[0];
      vec3 Z = la::cross(Sn, Sv[0]);
      if (la::dot(V, Z) > 0.0) {
        V = qIndex - p[1];
        Z = la::cross(Sn, Sv[1]);
        if (la::dot(V, Z) > 0.0) {
          V = qIndex - p[2];
          Z = la::cross(Sn, Sv[2]);
          if (la::dot(V, Z) > 0.0) {
            vec3 cp = qIndex + Sn * Tp[index] / Snl;
            vec3 cq = qIndex;
            return la::dot(cp - cq, cp - cq);
          }
        }
      }
    }
  }

  vec3 Tn = la::cross(Tv[0], Tv[1]);
  auto Tnl = la::dot(Tn, Tn);

  if (Tnl > 1e-15) {
    const vec3 Sp(la::dot(q[0] - p[0], Tn), la::dot(q[0] - p[1], Tn),
                  la::dot(q[0] - p[2], Tn));

    int index = -1;
    if ((Sp[0] > 0.0) && (Sp[1] > 0.0) && (Sp[2] > 0.0)) {
      index = Sp[0] < Sp[1] ? 0 : 1;
      if (Sp[2] < Sp[index]) index = 2;
    } else if ((Sp[0] < 0.0) && (Sp[1] < 0.0) && (Sp[2] < 0.0)) {
      index = Sp[0] > Sp[1] ? 0 : 1;
      if (Sp[2] > Sp[index]) index = 2;
    }

    if (index >= 0) {
      shown_disjoint = true;

      const vec3& pIndex = p[index];

      vec3 V = pIndex - q[0];
      vec3 Z = la::cross(Tn, Tv[0]);
      if (la::dot(V, Z) > 0.0) {
        V = pIndex - q[1];
        Z = la::cross(Tn, Tv[1]);
        if (la::dot(V, Z) > 0.0) {
          V = pIndex - q[2];
          Z = la::cross(Tn, Tv[2]);
          if (la::dot(V, Z) > 0.0) {
            vec3 cp = pIndex;
            vec3 cq = pIndex + Tn * Sp[index] / Tnl;
            return la::dot(cp - cq, cp - cq);
          }
        }
      }
    }
  }

  return shown_disjoint ? mindd : 0.0;
}